

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O0

void __thiscall
RootIndexProxyModelPrivate::onLayoutChanged
          (RootIndexProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  QModelIndex childIdx;
  bool bVar1;
  RootIndexProxyModel *pRVar2;
  RootIndexProxyModel *pRVar3;
  QList<QPersistentModelIndex> *this_00;
  bool bVar4;
  byte bVar5;
  long lVar6;
  qsizetype qVar7;
  const_reference pQVar8;
  bool local_162;
  QPersistentModelIndex local_120;
  QPersistentModelIndex local_118 [3];
  undefined1 local_100 [8];
  QModelIndex mappedParent;
  QModelIndex local_e0;
  QPersistentModelIndex local_c8;
  undefined8 uStack_c0;
  QAbstractItemModel *local_b8;
  QPersistentModelIndex *local_b0;
  QPersistentModelIndex *parent;
  const_iterator local_a0;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPersistentModelIndex> *__range1;
  bool addedInvalidIndex;
  undefined1 local_78 [8];
  QList<QPersistentModelIndex> parents;
  undefined1 local_48 [28];
  int local_2c;
  RootIndexProxyModel *pRStack_28;
  int i;
  RootIndexProxyModel *q;
  QList<QPersistentModelIndex> *pQStack_18;
  LayoutChangeHint hint_local;
  QList<QPersistentModelIndex> *sourceParents_local;
  RootIndexProxyModelPrivate *this_local;
  
  q._4_4_ = hint;
  pQStack_18 = sourceParents;
  sourceParents_local = (QList<QPersistentModelIndex> *)this;
  pRStack_28 = q_func(this);
  for (local_2c = 0; lVar6 = (long)local_2c, qVar7 = QList<QModelIndex>::size(&this->proxyIndexes),
      pRVar2 = pRStack_28, lVar6 < qVar7; local_2c = local_2c + 1) {
    pQVar8 = QList<QModelIndex>::at(&this->proxyIndexes,(long)local_2c);
    pRVar3 = pRStack_28;
    QList<QPersistentModelIndex>::at(&this->layoutChangePersistentIndexes,(long)local_2c);
    QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&parents.d.size);
    (**(code **)(*(long *)pRVar3 + 0x198))(local_48,pRVar3,&parents.d.size);
    QAbstractItemModel::changePersistentIndex((QModelIndex *)pRVar2,(QModelIndex *)pQVar8);
  }
  QList<QPersistentModelIndex>::clear(&this->layoutChangePersistentIndexes);
  QList<QModelIndex>::clear(&this->proxyIndexes);
  QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)local_78);
  qVar7 = QList<QPersistentModelIndex>::size(pQStack_18);
  QList<QPersistentModelIndex>::reserve((QList<QPersistentModelIndex> *)local_78,qVar7);
  this_00 = pQStack_18;
  bVar1 = false;
  __end1 = QList<QPersistentModelIndex>::begin(pQStack_18);
  local_a0 = QList<QPersistentModelIndex>::end(this_00);
  while( true ) {
    parent = local_a0.i;
    bVar4 = QList<QPersistentModelIndex>::const_iterator::operator!=(&__end1,local_a0);
    if (!bVar4) break;
    local_b0 = QList<QPersistentModelIndex>::const_iterator::operator*(&__end1);
    bVar5 = QPersistentModelIndex::isValid();
    local_162 = true;
    if ((bVar5 & 1) != 0) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_c8);
      QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&local_e0);
      childIdx.i = uStack_c0;
      childIdx._0_8_ = local_c8.d;
      childIdx.m = local_b8;
      local_162 = isDescendant(this,childIdx,&local_e0);
    }
    pRVar2 = pRStack_28;
    if (local_162 == false) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_118);
      (**(code **)(*(long *)pRVar2 + 0x198))(local_100,pRVar2,local_118);
      QPersistentModelIndex::QPersistentModelIndex(&local_120,(QModelIndex *)local_100);
      QList<QPersistentModelIndex>::operator<<((QList<QPersistentModelIndex> *)local_78,&local_120);
      QPersistentModelIndex::~QPersistentModelIndex(&local_120);
    }
    else if (!bVar1) {
      bVar1 = true;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&mappedParent.m);
      QList<QPersistentModelIndex>::operator<<
                ((QList<QPersistentModelIndex> *)local_78,(rvalue_ref)&mappedParent.m);
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&mappedParent.m);
    }
    QList<QPersistentModelIndex>::const_iterator::operator++(&__end1);
  }
  QAbstractItemModel::layoutChanged((QList_conflict2 *)pRStack_28,(LayoutChangeHint)local_78);
  QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)local_78);
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onLayoutChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(RootIndexProxyModel);
    for (int i = 0; i < proxyIndexes.size(); ++i)
        q->changePersistentIndex(proxyIndexes.at(i), q->mapFromSource(layoutChangePersistentIndexes.at(i)));
    layoutChangePersistentIndexes.clear();
    proxyIndexes.clear();
    QList<QPersistentModelIndex> parents;
    parents.reserve(sourceParents.size());
    bool addedInvalidIndex = false;
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid() || isDescendant(m_rootIndex, parent)) {
            if (!addedInvalidIndex) {
                addedInvalidIndex = true;
                parents << QPersistentModelIndex();
            }
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        Q_ASSERT(mappedParent.isValid());
        parents << mappedParent;
    }
    q->layoutChanged(parents, hint);
}